

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

Pass * wasm::createReorderFunctionsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x30);
  memset(this,0,0x30);
  ReorderFunctions::ReorderFunctions((ReorderFunctions *)this);
  return this;
}

Assistant:

Pass* createReorderFunctionsPass() { return new ReorderFunctions(); }